

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.h
# Opt level: O2

void __thiscall
rpn::CommandCallExpression::Evaluate(CommandCallExpression *this,EvaluationContext *context)

{
  results_iterator argsEnd;
  pointer pcVar1;
  size_t sVar2;
  
  sVar2 = EvaluateArity(this,&context->resultsCount);
  argsEnd._M_current =
       (context->results).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pcVar1 = (context->commandContext).result._M_dataplus._M_p;
  (context->commandContext).result._M_string_length = 0;
  *pcVar1 = '\0';
  CallCommand(this,argsEnd._M_current + -sVar2,argsEnd,&context->commandContext);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&context->results,(const_iterator)(argsEnd._M_current + -sVar2),
          (const_iterator)argsEnd._M_current);
  return;
}

Assistant:

void Evaluate(EvaluationContext& context) const final
    {
        const auto evaluatedArity = EvaluateArity(context.resultsCount);
        auto argsEnd = std::end(context.results);
        auto argsBegin = argsEnd - evaluatedArity;

        context.commandContext.result.clear();
        CallCommand(argsBegin, argsEnd, context.commandContext);

        context.results.erase(argsBegin, argsEnd);
    }